

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

void __thiscall re2::RE2::Options::Options(Options *this,CannedOptions opt)

{
  this->encoding_ = (opt == Latin1) + EncodingUTF8;
  this->posix_syntax_ = opt == POSIX;
  this->longest_match_ = opt == POSIX;
  this->log_errors_ = opt != Quiet;
  this->max_mem_ = 0x800000;
  this->literal_ = false;
  this->never_nl_ = false;
  this->dot_nl_ = false;
  this->never_capture_ = false;
  this->case_sensitive_ = true;
  this->perl_classes_ = false;
  this->word_boundary_ = false;
  this->one_line_ = false;
  return;
}

Assistant:

RE2::Options::Options(RE2::CannedOptions opt)
  : encoding_(opt == RE2::Latin1 ? EncodingLatin1 : EncodingUTF8),
    posix_syntax_(opt == RE2::POSIX),
    longest_match_(opt == RE2::POSIX),
    log_errors_(opt != RE2::Quiet),
    max_mem_(kDefaultMaxMem),
    literal_(false),
    never_nl_(false),
    dot_nl_(false),
    never_capture_(false),
    case_sensitive_(true),
    perl_classes_(false),
    word_boundary_(false),
    one_line_(false) {
}